

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.h
# Opt level: O1

float GD::inline_predict(vw *all,example *ec)

{
  byte bVar1;
  uint64_t uVar2;
  byte *pbVar3;
  float *pfVar4;
  float *pfVar5;
  example_predict *__range3;
  byte *pbVar6;
  unsigned_long *puVar7;
  float local_38;
  float local_34;
  
  local_34 = (ec->l).simple.initial;
  if ((all->weights).sparse == true) {
    pfVar5 = &local_34;
    foreach_feature<float,_const_float_&,_&GD::vec_add,_sparse_parameters>
              (&(all->weights).sparse_weights,all->ignore_some_linear,all->ignore_linear,
               &all->interactions,all->permutations,&ec->super_example_predict,pfVar5);
  }
  else {
    uVar2 = (ec->super_example_predict).ft_offset;
    pbVar6 = (ec->super_example_predict).indices._begin;
    pbVar3 = (ec->super_example_predict).indices._end;
    local_38 = local_34;
    if (all->ignore_some_linear == false) {
      if (pbVar6 != pbVar3) {
        do {
          bVar1 = *pbVar6;
          pfVar5 = (ec->super_example_predict).feature_space[bVar1].values._begin;
          pfVar4 = (ec->super_example_predict).feature_space[bVar1].values._end;
          if (pfVar5 != pfVar4) {
            puVar7 = (ec->super_example_predict).feature_space[bVar1].indicies._begin;
            do {
              local_34 = local_34 +
                         (all->weights).dense_weights._begin
                         [*puVar7 + uVar2 & (all->weights).dense_weights._weight_mask] * *pfVar5;
              pfVar5 = pfVar5 + 1;
              puVar7 = puVar7 + 1;
              local_38 = local_34;
            } while (pfVar5 != pfVar4);
          }
          pbVar6 = pbVar6 + 1;
        } while (pbVar6 != pbVar3);
      }
    }
    else if (pbVar6 != pbVar3) {
      do {
        bVar1 = *pbVar6;
        if (all->ignore_linear[bVar1] == false) {
          pfVar5 = (ec->super_example_predict).feature_space[bVar1].values._begin;
          pfVar4 = (ec->super_example_predict).feature_space[bVar1].values._end;
          if (pfVar5 != pfVar4) {
            puVar7 = (ec->super_example_predict).feature_space[bVar1].indicies._begin;
            do {
              local_34 = local_34 +
                         (all->weights).dense_weights._begin
                         [*puVar7 + uVar2 & (all->weights).dense_weights._weight_mask] * *pfVar5;
              pfVar5 = pfVar5 + 1;
              puVar7 = puVar7 + 1;
              local_38 = local_34;
            } while (pfVar5 != pfVar4);
          }
        }
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != pbVar3);
    }
    pfVar5 = &local_38;
    INTERACTIONS::
    generate_interactions<float,_const_float_&,_&GD::vec_add,_false,_&GD::dummy_func,_dense_parameters>
              (&all->interactions,all->permutations,&ec->super_example_predict,pfVar5,
               &(all->weights).dense_weights);
  }
  return *pfVar5;
}

Assistant:

inline float inline_predict(vw& all, example& ec)
{
  return all.weights.sparse ? inline_predict<sparse_parameters>(all.weights.sparse_weights, all.ignore_some_linear,
                                  all.ignore_linear, all.interactions, all.permutations, ec, ec.l.simple.initial)
                            : inline_predict<dense_parameters>(all.weights.dense_weights, all.ignore_some_linear,
                                  all.ignore_linear, all.interactions, all.permutations, ec, ec.l.simple.initial);
}